

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.cpp
# Opt level: O3

void __thiscall Archive::dump(Archive *this)

{
  int iVar1;
  uint uVar2;
  pointer pcVar3;
  uint *puVar4;
  long lVar5;
  uint uVar6;
  string local_78;
  undefined1 auStack_58 [8];
  child_iterator c;
  
  pcVar3 = (this->data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  printf("Archive data %p len %zu, firstRegularData %p\n",pcVar3,
         (long)(this->data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)pcVar3,this->firstRegularData);
  printf("Symbol table %p, len %u\n",(this->symbolTable).data,(ulong)(this->symbolTable).len);
  printf("string table %p, len %u\n",(this->stringTable).data,(ulong)(this->stringTable).len);
  puVar4 = (uint *)(this->symbolTable).data;
  if (puVar4 == (uint *)0x0) {
    if ((this->data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      auStack_58 = (undefined1  [8])0x0;
      c.child.parent._0_4_ = 0;
      c.child.parent._4_2_ = 0;
      c.child.parent._6_2_ = 0;
      c.child.data._0_4_ = 0;
      c.child.data._4_2_ = 0;
      c.child.len._0_1_ = 0;
      Child::Child((Child *)&local_78,this,this->firstRegularData,(bool *)&c.child.len);
      c.child.data._0_4_ = (uint)local_78.field_2._M_allocated_capacity._0_6_;
      c.child.data._4_2_ = (ushort)((uint6)local_78.field_2._0_6_ >> 0x20);
      c.child.parent._0_4_ = (undefined4)local_78._M_string_length;
      c.child.parent._4_2_ = local_78._M_string_length._4_2_;
      c.child.parent._6_2_ = local_78._M_string_length._6_2_;
      lVar5 = CONCAT26(local_78._M_string_length._6_2_,
                       CONCAT24(local_78._M_string_length._4_2_,
                                (undefined4)local_78._M_string_length));
      if (lVar5 != 0) {
        do {
          uVar6 = (uint)c.child.data;
          Child::getName_abi_cxx11_(&local_78,(Child *)auStack_58);
          printf("Child %p, len %u, name %s, size %u\n",lVar5,(ulong)uVar6,
                 CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_),
                 (ulong)((uint)c.child.data - c.child.data._4_2_));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_) !=
              &local_78.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_
                                    ),
                            CONCAT26(local_78.field_2._M_allocated_capacity._6_2_,
                                     local_78.field_2._M_allocated_capacity._0_6_) + 1);
          }
          child_iterator::operator++((child_iterator *)auStack_58);
          lVar5 = CONCAT26(c.child.parent._6_2_,CONCAT24(c.child.parent._4_2_,c.child.parent._0_4_))
          ;
        } while (lVar5 != 0);
      }
    }
  }
  else {
    uVar6 = *puVar4;
    uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    printf("Symbol count %u\n",(ulong)uVar6);
    if (uVar6 != 0) {
      iVar1 = *(int *)&(this->symbolTable).data;
      do {
        printf("Symbol %u, offset %u\n",0,(ulong)((((int)puVar4 + uVar6 * 4) - iVar1) + 4));
        uVar2 = *(uint *)(this->symbolTable).data;
        auStack_58 = (undefined1  [8])0x0;
        c.child.parent._0_4_ = 0;
        c.child.parent._4_2_ = 0;
        c.child.parent._6_2_ = 0;
        c.child.data._0_4_ = 0;
        c.child.data._4_2_ = 0;
        c.child.len._0_1_ = 0;
        Child::Child((Child *)&local_78,this,
                     (uint8_t *)
                     ((this->data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_start +
                     (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                     uVar2 << 0x18)),(bool *)&c.child.len);
        c.child.data._0_4_ = (uint)local_78.field_2._M_allocated_capacity._0_6_;
        c.child.data._4_2_ = (ushort)((uint6)local_78.field_2._0_6_ >> 0x20);
        c.child.parent._0_4_ = (undefined4)local_78._M_string_length;
        printf("Child %p, len %u\n",
               CONCAT26(local_78._M_string_length._6_2_,
                        CONCAT24(local_78._M_string_length._4_2_,
                                 (undefined4)local_78._M_string_length)),(ulong)(uint)c.child.data);
      } while( true );
    }
  }
  return;
}

Assistant:

void Archive::dump() const {
  printf("Archive data %p len %zu, firstRegularData %p\n",
         data.data(),
         data.size(),
         firstRegularData);
  printf("Symbol table %p, len %u\n", symbolTable.data, symbolTable.len);
  printf("string table %p, len %u\n", stringTable.data, stringTable.len);
  const uint8_t* buf = symbolTable.data;
  if (!buf) {
    for (auto c = child_begin(), e = child_end(); c != e; ++c) {
      printf("Child %p, len %u, name %s, size %u\n",
             c->data,
             c->len,
             c->getName().c_str(),
             c->getSize());
    }
    return;
  }
  uint32_t symbolCount = read32be(buf);
  printf("Symbol count %u\n", symbolCount);
  buf += sizeof(uint32_t) + (symbolCount * sizeof(uint32_t));
  uint32_t string_start_offset = buf - symbolTable.data;
  Symbol sym = {0, string_start_offset};
  while (sym.symbolIndex != symbolCount) {
    printf("Symbol %u, offset %u\n", sym.symbolIndex, sym.stringIndex);
    // get the member
    uint32_t offset = read32be(symbolTable.data + sym.symbolIndex * 4);
    auto* loc = (const uint8_t*)&data[offset];
    child_iterator it;
    it.child = Child(this, loc, &it.error);
    printf("Child %p, len %u\n", it.child.data, it.child.len);
  }
}